

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

int merged(int lA,int lB)

{
  int iVar1;
  instrStruct *piVar2;
  int pos;
  
  if (lA != 0) {
    piVar2 = getInstruction(lA);
    iVar1 = bigNum;
    while( true ) {
      pos = piVar2->instr % iVar1;
      if (pos == 0) break;
      piVar2 = getInstruction(pos);
    }
    piVar2->instr = piVar2->instr + lB;
    lB = lA;
  }
  return lB;
}

Assistant:

procedure 
int merged(int lA, int lB) {
	variable int lC; variable int lD;
	variable struct instrStruct *element;
	lC = 0; lD = 0;
	if (lA != 0) {
		lC = lA;
		element = getInstruction(lC);
		lD = element->instr % bigNum;
		while (lD != 0) {
			lC = lD;
			element = getInstruction(lC);
			lD = element->instr % bigNum;
		}
		element->instr = element->instr - lD + lB;
		return lA;
	}
	return lB;
}